

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<int_*(unsigned_long)> * __thiscall
testing::internal::FunctionMocker<int_*(unsigned_long)>::With
          (FunctionMocker<int_*(unsigned_long)> *this,Matcher<unsigned_long> *m1)

{
  MatcherBase<unsigned_long> local_20;
  
  Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_20,m1);
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::operator=
            (&(this->super_FunctionMockerBase<int_*(unsigned_long)>).current_spec_.matchers_.f0_.
              super_MatcherBase<unsigned_long>.impl_,&local_20.impl_);
  MatcherBase<unsigned_long>::~MatcherBase(&local_20);
  return &(this->super_FunctionMockerBase<int_*(unsigned_long)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }